

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_loader_c(lua_State *L)

{
  int iVar1;
  char *name_00;
  char *path;
  char *filename;
  char *name;
  lua_State *L_local;
  
  name_00 = luaL_checklstring(L,1,(size_t *)0x0);
  path = findfile(L,name_00,"cpath");
  if ((path != (char *)0x0) && (iVar1 = ll_loadfunc(L,path,name_00,0), iVar1 != 0)) {
    loaderror(L,path);
  }
  return 1;
}

Assistant:

static int lj_cf_package_loader_c(lua_State *L)
{
  const char *name = luaL_checkstring(L, 1);
  const char *filename = findfile(L, name, "cpath");
  if (filename == NULL) return 1;  /* library not found in this path */
  if (ll_loadfunc(L, filename, name, 0) != 0)
    loaderror(L, filename);
  return 1;  /* library loaded successfully */
}